

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void plot_masked_sprite_16px_left(tgestate_t *state,uint8_t x)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  byte bVar16;
  byte *pbVar17;
  
  bVar7 = x - 4;
  puVar2 = state->bitmap_pointer;
  puVar3 = state->mask_pointer;
  uVar1 = (state->spriteplotter).height_16_right;
  lVar8 = 0;
  do {
    bVar12 = puVar2[lVar8 * 2];
    bVar9 = puVar2[lVar8 * 2 + 1];
    bVar10 = puVar3[lVar8 * 2];
    bVar14 = puVar3[lVar8 * 2 + 1];
    if ((char)state->sprite_index < '\0') {
      uVar15 = (ulong)bVar12;
      uVar5 = (ulong)bVar10;
      bVar10 = state->reversed[bVar14];
      bVar14 = state->reversed[uVar5];
      bVar12 = state->reversed[bVar9];
      bVar9 = state->reversed[uVar15];
    }
    bVar6 = 0xff;
    bVar13 = bVar14;
    if (x == '\x04') {
      bVar13 = bVar14 * '\x02' + 1;
      bVar6 = bVar10 >> 7;
      bVar10 = bVar10 * '\x02' | bVar14 >> 7;
      bVar6 = bVar6 | 0xfe;
    }
    bVar16 = bVar10;
    bVar14 = bVar13;
    if (bVar7 < 2) {
      bVar14 = bVar13 * '\x02' + 1;
      bVar16 = bVar10 * '\x02' | bVar13 >> 7;
      bVar6 = bVar6 * '\x02' | bVar10 >> 7;
    }
    bVar13 = bVar16;
    bVar10 = bVar14;
    if (bVar7 < 3) {
      bVar10 = bVar14 * '\x02' + 1;
      bVar13 = bVar16 * '\x02' | bVar14 >> 7;
      bVar6 = bVar6 * '\x02' | bVar16 >> 7;
    }
    bVar14 = bVar13;
    bVar16 = bVar10;
    if (bVar7 < 4) {
      bVar16 = bVar10 * '\x02' + 1;
      bVar14 = bVar13 * '\x02' | bVar10 >> 7;
      bVar6 = bVar6 * '\x02' | bVar13 >> 7;
    }
    if (x == '\x04') {
      bVar10 = bVar9 * '\x02';
      bVar13 = bVar12 >> 7;
      bVar12 = bVar12 * '\x02' | bVar9 >> 7;
    }
    else {
      bVar13 = 0;
      bVar10 = bVar9;
    }
    bVar11 = bVar12;
    bVar9 = bVar10;
    if (bVar7 < 2) {
      bVar9 = bVar10 * '\x02';
      bVar11 = bVar12 * '\x02' | bVar10 >> 7;
      bVar13 = bVar13 * '\x02' | bVar12 >> 7;
    }
    bVar12 = bVar11;
    bVar10 = bVar9;
    if (bVar7 < 3) {
      bVar10 = bVar9 * '\x02';
      bVar12 = bVar11 * '\x02' | bVar9 >> 7;
      bVar13 = bVar13 * '\x02' | bVar11 >> 7;
    }
    bVar11 = bVar12;
    bVar9 = bVar10;
    if (bVar7 < 4) {
      bVar9 = bVar10 * '\x02';
      bVar11 = bVar12 * '\x02' | bVar10 >> 7;
      bVar13 = bVar13 * '\x02' | bVar12 >> 7;
    }
    pbVar4 = state->foreground_mask_pointer;
    pbVar17 = state->window_buf_pointer;
    if ((state->spriteplotter).enable_16_right_1 != '\0') {
      *pbVar17 = bVar13 & *pbVar4 | (bVar6 | ~*pbVar4) & *pbVar17;
    }
    if ((state->spriteplotter).enable_16_right_2 != '\0') {
      pbVar17[1] = bVar11 & pbVar4[1] | (bVar14 | ~pbVar4[1]) & pbVar17[1];
    }
    pbVar17 = pbVar17 + 2;
    if ((state->spriteplotter).enable_16_right_3 != '\0') {
      *pbVar17 = bVar9 & pbVar4[2] | (bVar16 | ~pbVar4[2]) & *pbVar17;
    }
    state->foreground_mask_pointer = pbVar4 + 4;
    state->window_buf_pointer = pbVar17 + (long)state->columns + -2;
    lVar8 = lVar8 + 1;
  } while (uVar1 != (uint8_t)lVar8);
  return;
}

Assistant:

void plot_masked_sprite_16px_left(tgestate_t *state, uint8_t x)
{
  uint8_t        iters;       /* was B */
  const uint8_t *maskptr;     /* was HL' */
  const uint8_t *bitmapptr;   /* was HL */
  const uint8_t *foremaskptr; /* was HL */
  uint8_t       *screenptr;   /* was HL */

  assert(state != NULL);
  assert(x >= 4 && x < 8);

  ASSERT_MASK_BUF_PTR_VALID(state->foreground_mask_pointer);

  x -= 4; /* jump table offset (on input, x is 4..7) */

  maskptr   = state->mask_pointer;
  bitmapptr = state->bitmap_pointer;

  assert(maskptr   != NULL);
  assert(bitmapptr != NULL);

  iters = state->spriteplotter.height_16_right; /* self modified by $E49D (setup_vischar_plotting) */
  assert(iters <= MASK_BUFFER_HEIGHT * 8);

  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer, 2);
  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer + (iters - 1) * state->columns + 2 - 1, 2);
  do
  {
    /* Note the different variable order to the right shifting case above. */
    uint8_t bm0, bm1, bm2;       /* was E, D, C */
    uint8_t mask0, mask1, mask2; /* was E', D', C' */
    int     carry = 0;

    /* Load bitmap bytes into D,E. */
    bm1 = *bitmapptr++;
    bm0 = *bitmapptr++;

    /* Load mask bytes into D',E'. */
    mask1 = *maskptr++;
    mask0 = *maskptr++;

    if (state->sprite_index & sprite_FLAG_FLIP)
      flip_16_masked_pixels(state, &mask1, &mask0, &bm1, &bm0);

    foremaskptr = state->foreground_mask_pointer;
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* Shift mask bytes */

    mask2 = 0xFF; /* all bits set => mask off */
    carry = 1; /* mask off */
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      RL(mask0);
      RL(mask1);
      RL(mask2);
    }
    if (x <= 1)
    {
      RL(mask0);
      RL(mask1);
      RL(mask2);
    }
    if (x <= 2)
    {
      RL(mask0);
      RL(mask1);
      RL(mask2);
    }
    if (x <= 3)
    {
      RL(mask0);
      RL(mask1);
      RL(mask2);
    }

    /* Shift bitmap bytes */

    bm2 = 0; /* all bits clear => pixels off */
    // no carry reset in this variant?
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      SLA(bm0);
      RL(bm1);
      RL(bm2);
    }
    if (x <= 1)
    {
      SLA(bm0);
      RL(bm1);
      RL(bm2);
    }
    if (x <= 2)
    {
      SLA(bm0);
      RL(bm1);
      RL(bm2);
    }
    if (x <= 3)
    {
      SLA(bm0);
      RL(bm1);
      RL(bm2);
    }

    /* Plot, using foreground mask. */

    screenptr = state->window_buf_pointer; // line moved relative to the 24 version
    ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* Conv: We form 'mask' inside of the enable_* condition. The original
     * game got away with accessing out-of-bounds memory but we can't. */

    if (state->spriteplotter.enable_16_right_1)
      *screenptr = MASK(bm2, mask2);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_right_2)
      *screenptr = MASK(bm1, mask1);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_right_3)
      *screenptr = MASK(bm0, mask0);
    foremaskptr += 2;
    state->foreground_mask_pointer = foremaskptr;

    screenptr += state->columns - 2; /* was 22 */
    if (iters > 1)
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    state->window_buf_pointer = screenptr;
  }
  while (--iters);
}